

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7_test.cc
# Opt level: O2

void __thiscall
PKCS7Test_KernelModuleSigning_Test::TestBody(PKCS7Test_KernelModuleSigning_Test *this)

{
  PKCS7 *pPVar1;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char *pcVar2;
  char *in_R9;
  bool bVar3;
  AssertHelper local_100;
  Bytes local_f8;
  AssertionResult gtest_ar__1;
  UniquePtr<EVP_PKEY> key;
  UniquePtr<X509> cert;
  AssertionResult gtest_ar_;
  UniquePtr<BIO> data_bio;
  UniquePtr<PKCS7> pkcs7;
  int pkcs7_len;
  string expected;
  UniquePtr<uint8_t> pkcs7_storage;
  uint8_t *pkcs7_bytes;
  UniquePtr<BIO> key_bio;
  UniquePtr<BIO> cert_bio;
  string key_pem;
  string cert_pem;
  
  GetTestData_abi_cxx11_(&cert_pem,"crypto/pkcs7/test/sign_cert.pem");
  GetTestData_abi_cxx11_(&key_pem,"crypto/pkcs7/test/sign_key.pem");
  cert_bio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_bio_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<bio_st,_bssl::internal::Deleter,_true,_true>)
                 BIO_new_mem_buf(cert_pem._M_dataplus._M_p,(int)cert_pem._M_string_length);
  cert._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_x509_st_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<x509_st,_bssl::internal::Deleter,_true,_true>)
       PEM_read_bio_X509((BIO *)cert_bio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>
                                ._M_t.super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_bio_st_*,_false>._M_head_impl,(X509 **)0x0,
                         (undefined1 *)0x0,(void *)0x0);
  key_bio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_bio_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<bio_st,_bssl::internal::Deleter,_true,_true>)
                 BIO_new_mem_buf(key_pem._M_dataplus._M_p,(int)key_pem._M_string_length);
  key._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<evp_pkey_st,_bssl::internal::Deleter,_true,_true>)
       PEM_read_bio_PrivateKey
                 ((BIO *)key_bio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_bio_st_*,_false>._M_head_impl,(EVP_PKEY **)0x0,
                  (undefined1 *)0x0,(void *)0x0);
  data_bio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_bio_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<bio_st,_bssl::internal::Deleter,_true,_true>)
                 BIO_new_mem_buf("signed data",0xb);
  pkcs7._M_t.super___uniq_ptr_impl<PKCS7,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_PKCS7_*,_bssl::internal::Deleter>.super__Head_base<0UL,_PKCS7_*,_false>.
  _M_head_impl = (__uniq_ptr_data<PKCS7,_bssl::internal::Deleter,_true,_true>)
                 PKCS7_sign((X509 *)cert._M_t.
                                    super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                                    super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                    super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,
                            (EVP_PKEY *)
                            key._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>.
                            _M_t.super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl,
                            (stack_st_X509 *)0x0,
                            (BIO *)data_bio._M_t.
                                   super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                                   super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_bio_st_*,_false>._M_head_impl,0x1c2);
  this_00 = &gtest_ar_.message_;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       (tuple<PKCS7_*,_bssl::internal::Deleter>)
       pkcs7._M_t.super___uniq_ptr_impl<PKCS7,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_PKCS7_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_PKCS7_*,_false>._M_head_impl != (_Head_base<0UL,_PKCS7_*,_false>)0x0;
  if ((tuple<PKCS7_*,_bssl::internal::Deleter>)
      pkcs7._M_t.super___uniq_ptr_impl<PKCS7,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_PKCS7_*,_bssl::internal::Deleter>.super__Head_base<0UL,_PKCS7_*,_false>
      ._M_head_impl == (_Head_base<0UL,_PKCS7_*,_false>)0x0) {
    testing::Message::Message((Message *)&gtest_ar__1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&expected,(internal *)&gtest_ar_,(AssertionResult *)"pkcs7","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
               ,0x1d7,(char *)CONCAT71(expected._M_dataplus._M_p._1_7_,
                                       (char)expected._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
    std::__cxx11::string::~string((string *)&expected);
    if (gtest_ar__1._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__1._0_8_ + 8))();
    }
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(this_00);
    pkcs7_bytes = (uint8_t *)0x0;
    pkcs7_len = i2d_PKCS7((PKCS7 *)pkcs7._M_t.super___uniq_ptr_impl<PKCS7,_bssl::internal::Deleter>.
                                   _M_t.super__Tuple_impl<0UL,_PKCS7_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_PKCS7_*,_false>._M_head_impl,&pkcs7_bytes);
    gtest_ar_.success_ = false;
    gtest_ar_._1_3_ = 0;
    testing::internal::CmpHelperGE<int,int>
              ((internal *)&expected,"pkcs7_len","0",&pkcs7_len,(int *)&gtest_ar_);
    if ((char)expected._M_dataplus._M_p != '\0') {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&expected._M_string_length);
      pkcs7_storage._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)
           (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)pkcs7_bytes;
      GetTestData_abi_cxx11_(&expected,"crypto/pkcs7/test/sign_sha256.p7s");
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(long)pkcs7_len;
      gtest_ar__1._0_8_ = pkcs7_bytes;
      local_f8.span_.data_ =
           (uchar *)CONCAT71(expected._M_dataplus._M_p._1_7_,(char)expected._M_dataplus._M_p);
      local_f8.span_.size_ = expected._M_string_length;
      testing::internal::CmpHelperEQ<Bytes,Bytes>
                ((internal *)&gtest_ar_,"Bytes(pkcs7_bytes, pkcs7_len)","Bytes(expected)",
                 (Bytes *)&gtest_ar__1,&local_f8);
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar__1);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar_.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)gtest_ar_.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_f8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                   ,0x1e0,pcVar2);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&local_f8,(Message *)&gtest_ar__1);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
        if (gtest_ar__1._0_8_ != 0) {
          (**(code **)(*(long *)gtest_ar__1._0_8_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      pPVar1 = PKCS7_sign((X509 *)cert._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>.
                                  _M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,
                          (EVP_PKEY *)
                          key._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                          super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl,
                          (stack_st_X509 *)0x0,
                          (BIO *)data_bio._M_t.
                                 super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                                 super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_bio_st_*,_false>._M_head_impl,0x182);
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      bVar3 = pPVar1 == (PKCS7 *)0x0;
      gtest_ar__1.success_ = bVar3;
      if (!bVar3) {
        testing::Message::Message((Message *)&local_f8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
                   (AssertionResult *)
                   "PKCS7_sign(cert.get(), key.get(), nullptr, data_bio.get(), 0x100 | 0x80 | 0x2)",
                   "true","false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_100,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                   ,0x1e5,(char *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_));
        testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
        testing::internal::AssertHelper::~AssertHelper(&local_100);
        std::__cxx11::string::~string((string *)&gtest_ar_);
        if ((long *)local_f8.span_.data_ != (long *)0x0) {
          (**(code **)(*(long *)local_f8.span_.data_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__1.message_);
      pPVar1 = PKCS7_sign((X509 *)cert._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>.
                                  _M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,
                          (EVP_PKEY *)
                          key._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                          super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl,
                          (stack_st_X509 *)0x0,
                          (BIO *)data_bio._M_t.
                                 super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                                 super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_bio_st_*,_false>._M_head_impl,0xc2);
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar__1.success_ = pPVar1 == (PKCS7 *)0x0;
      if (!gtest_ar__1.success_) {
        testing::Message::Message((Message *)&local_f8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
                   (AssertionResult *)
                   "PKCS7_sign(cert.get(), key.get(), nullptr, data_bio.get(), 0x80 | 0x2 | 0x40)",
                   "true","false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_100,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                   ,0x1e8,(char *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_));
        testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
        testing::internal::AssertHelper::~AssertHelper(&local_100);
        std::__cxx11::string::~string((string *)&gtest_ar_);
        if ((long *)local_f8.span_.data_ != (long *)0x0) {
          (**(code **)(*(long *)local_f8.span_.data_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__1.message_);
      pPVar1 = PKCS7_sign((X509 *)cert._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>.
                                  _M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,
                          (EVP_PKEY *)
                          key._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                          super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl,
                          (stack_st_X509 *)0x0,
                          (BIO *)data_bio._M_t.
                                 super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                                 super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_bio_st_*,_false>._M_head_impl,0x143);
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar__1.success_ = pPVar1 == (PKCS7 *)0x0;
      if (!gtest_ar__1.success_) {
        testing::Message::Message((Message *)&local_f8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
                   (AssertionResult *)
                   "PKCS7_sign(cert.get(), key.get(), nullptr, data_bio.get(), 0x100 | 0x1 | 0x2 | 0x40)"
                   ,"true","false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_100,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                   ,0x1eb,(char *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_));
        testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
        testing::internal::AssertHelper::~AssertHelper(&local_100);
        std::__cxx11::string::~string((string *)&gtest_ar_);
        if ((long *)local_f8.span_.data_ != (long *)0x0) {
          (**(code **)(*(long *)local_f8.span_.data_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__1.message_);
      pPVar1 = PKCS7_sign((X509 *)cert._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>.
                                  _M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,
                          (EVP_PKEY *)
                          key._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                          super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl,
                          (stack_st_X509 *)0x0,
                          (BIO *)data_bio._M_t.
                                 super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                                 super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_bio_st_*,_false>._M_head_impl,0x1c0);
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar__1.success_ = pPVar1 == (PKCS7 *)0x0;
      if (pPVar1 != (PKCS7 *)0x0) {
        testing::Message::Message((Message *)&local_f8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
                   (AssertionResult *)
                   "PKCS7_sign(cert.get(), key.get(), nullptr, data_bio.get(), 0x100 | 0x80 | 0x40)"
                   ,"true","false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_100,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                   ,0x1ee,(char *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_));
        testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
        testing::internal::AssertHelper::~AssertHelper(&local_100);
        std::__cxx11::string::~string((string *)&gtest_ar_);
        if ((long *)local_f8.span_.data_ != (long *)0x0) {
          (**(code **)(*(long *)local_f8.span_.data_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__1.message_);
      ERR_clear_error();
      std::__cxx11::string::~string((string *)&expected);
      std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr(&pkcs7_storage);
      goto LAB_002f9f3c;
    }
    testing::Message::Message((Message *)&gtest_ar_);
    if (expected._M_string_length == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)expected._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
               ,0x1db,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1,(Message *)&gtest_ar_);
    this_00 = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&expected._M_string_length;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1);
    if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(this_00);
LAB_002f9f3c:
  std::unique_ptr<PKCS7,_bssl::internal::Deleter>::~unique_ptr(&pkcs7);
  std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr(&data_bio);
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr(&key);
  std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr(&key_bio);
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&cert);
  std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr(&cert_bio);
  std::__cxx11::string::~string((string *)&key_pem);
  std::__cxx11::string::~string((string *)&cert_pem);
  return;
}

Assistant:

TEST(PKCS7Test, KernelModuleSigning) {
  // Sign a message with the same call that the Linux kernel's sign-file.c
  // makes.
  std::string cert_pem = GetTestData("crypto/pkcs7/test/sign_cert.pem");
  std::string key_pem = GetTestData("crypto/pkcs7/test/sign_key.pem");
  bssl::UniquePtr<BIO> cert_bio(
      BIO_new_mem_buf(cert_pem.data(), cert_pem.size()));
  bssl::UniquePtr<X509> cert(
      PEM_read_bio_X509(cert_bio.get(), nullptr, nullptr, nullptr));

  bssl::UniquePtr<BIO> key_bio(BIO_new_mem_buf(key_pem.data(), key_pem.size()));
  bssl::UniquePtr<EVP_PKEY> key(
      PEM_read_bio_PrivateKey(key_bio.get(), nullptr, nullptr, nullptr));

  static const char kSignedData[] = "signed data";
  bssl::UniquePtr<BIO> data_bio(
      BIO_new_mem_buf(kSignedData, sizeof(kSignedData) - 1));

  bssl::UniquePtr<PKCS7> pkcs7(
      PKCS7_sign(cert.get(), key.get(), /*certs=*/nullptr, data_bio.get(),
                 PKCS7_NOATTR | PKCS7_BINARY | PKCS7_NOCERTS | PKCS7_DETACHED));
  ASSERT_TRUE(pkcs7);

  uint8_t *pkcs7_bytes = nullptr;
  const int pkcs7_len = i2d_PKCS7(pkcs7.get(), &pkcs7_bytes);
  ASSERT_GE(pkcs7_len, 0);
  bssl::UniquePtr<uint8_t> pkcs7_storage(pkcs7_bytes);

  // RSA signatures are deterministic so the output should not change.
  std::string expected = GetTestData("crypto/pkcs7/test/sign_sha256.p7s");
  EXPECT_EQ(Bytes(pkcs7_bytes, pkcs7_len), Bytes(expected));

  // Other option combinations should fail.
  EXPECT_FALSE(
      PKCS7_sign(cert.get(), key.get(), /*certs=*/nullptr, data_bio.get(),
                 PKCS7_NOATTR | PKCS7_BINARY | PKCS7_NOCERTS));
  EXPECT_FALSE(
      PKCS7_sign(cert.get(), key.get(), /*certs=*/nullptr, data_bio.get(),
                 PKCS7_BINARY | PKCS7_NOCERTS | PKCS7_DETACHED));
  EXPECT_FALSE(
      PKCS7_sign(cert.get(), key.get(), /*certs=*/nullptr, data_bio.get(),
                 PKCS7_NOATTR | PKCS7_TEXT | PKCS7_NOCERTS | PKCS7_DETACHED));
  EXPECT_FALSE(
      PKCS7_sign(cert.get(), key.get(), /*certs=*/nullptr, data_bio.get(),
                 PKCS7_NOATTR | PKCS7_BINARY | PKCS7_DETACHED));

  ERR_clear_error();
}